

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

bool __thiscall BigNumber::operator==(BigNumber *this,BigNumber *that)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  const_reference pvVar4;
  int local_34;
  int i;
  SYMBOL symbolB;
  SYMBOL symbolA;
  int len_b;
  int len_a;
  BigNumber *that_local;
  BigNumber *this_local;
  
  sVar2 = length(this);
  sVar3 = length(that);
  if (((int)sVar2 == (int)sVar3) && (this->m_symbol == that->m_symbol)) {
    for (local_34 = 0; local_34 < (int)sVar2; local_34 = local_34 + 1) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_digits,(long)local_34);
      cVar1 = *pvVar4;
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&that->m_digits,(long)local_34);
      if (cVar1 != *pvVar4) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BigNumber::operator==(const BigNumber &that) const
{
    int len_a=this->length();
    int len_b=that.length();
    SYMBOL symbolA=this->m_symbol;
    SYMBOL symbolB=that.m_symbol;
    if (len_a!=len_b||symbolA!=symbolB)
        return false;
    else
    {
        for(int i=0;i<len_a;++i)
        {
            if(this->m_digits[i]!=that.m_digits[i])
                return false;
        }
        return true;
    }
}